

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

void opj_image_destroy(opj_image_t *image)

{
  void *ptr;
  long lVar1;
  OPJ_UINT32 compno;
  ulong uVar2;
  
  if (image != (opj_image_t *)0x0) {
    if (image->comps != (opj_image_comp_t *)0x0) {
      lVar1 = 0x30;
      for (uVar2 = 0; uVar2 < image->numcomps; uVar2 = uVar2 + 1) {
        ptr = *(void **)((long)&image->comps->dx + lVar1);
        if (ptr != (void *)0x0) {
          opj_image_data_free(ptr);
        }
        lVar1 = lVar1 + 0x40;
      }
      opj_free(image->comps);
    }
    if (image->icc_profile_buf != (OPJ_BYTE *)0x0) {
      opj_free(image->icc_profile_buf);
    }
    opj_free(image);
    return;
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_image_destroy(opj_image_t *image)
{
    if (image) {
        if (image->comps) {
            OPJ_UINT32 compno;

            /* image components */
            for (compno = 0; compno < image->numcomps; compno++) {
                opj_image_comp_t *image_comp = &(image->comps[compno]);
                if (image_comp->data) {
                    opj_image_data_free(image_comp->data);
                }
            }
            opj_free(image->comps);
        }

        if (image->icc_profile_buf) {
            opj_free(image->icc_profile_buf);
        }

        opj_free(image);
    }
}